

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O3

Ptr<ImageView> __thiscall
myvk::ImageView::Create
          (ImageView *this,Ptr<ImageBase> *image,VkImageViewType view_type,
          VkImageAspectFlags aspect_mask)

{
  element_type *peVar1;
  Ptr<ImageView> PVar2;
  VkImageViewCreateInfo local_58;
  
  peVar1 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.pNext = (void *)0x0;
  local_58.flags = 0;
  local_58._20_4_ = 0;
  local_58.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_58._4_4_ = 0;
  local_58.image = peVar1->m_image;
  local_58.format = peVar1->m_format;
  local_58.viewType = view_type;
  local_58.subresourceRange.baseMipLevel = 0;
  local_58.subresourceRange.aspectMask = aspect_mask;
  local_58.subresourceRange.baseArrayLayer = 0;
  local_58.subresourceRange.levelCount = peVar1->m_mip_levels;
  local_58._76_4_ = 0;
  local_58.subresourceRange.layerCount = peVar1->m_array_layers;
  local_58.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_58.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_58.components.b = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_58.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  PVar2 = Create(this,image,&local_58);
  PVar2.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ImageView>)PVar2.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ImageView> ImageView::Create(const Ptr<ImageBase> &image, VkImageViewType view_type,
                                 VkImageAspectFlags aspect_mask) {
	return Create(image, view_type, image->GetFormat(), aspect_mask, 0, image->GetMipLevels(), 0,
	              image->GetArrayLayers());
}